

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.h
# Opt level: O2

void __thiscall llvm::APInt::setBits(APInt *this,uint loBit,uint hiBit)

{
  uint uVar1;
  ulong uVar2;
  
  uVar1 = this->BitWidth;
  if (uVar1 < hiBit) {
    __assert_fail("hiBit <= BitWidth && \"hiBit out of range\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/APInt.h"
                  ,0x584,"void llvm::APInt::setBits(unsigned int, unsigned int)");
  }
  if (loBit <= uVar1) {
    if (hiBit < loBit) {
      __assert_fail("loBit <= hiBit && \"loBit greater than hiBit\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/APInt.h"
                    ,0x586,"void llvm::APInt::setBits(unsigned int, unsigned int)");
    }
    if (loBit != hiBit) {
      if (0x40 < hiBit || 0x3f < loBit) {
        setBitsSlowCase(this,loBit,hiBit);
        return;
      }
      uVar2 = (0xffffffffffffffffU >> ((byte)loBit - (char)hiBit & 0x3f)) << ((byte)loBit & 0x3f);
      if (uVar1 < 0x41) {
        (this->U).VAL = (this->U).VAL | uVar2;
      }
      else {
        *(this->U).pVal = *(this->U).pVal | uVar2;
      }
    }
    return;
  }
  __assert_fail("loBit <= BitWidth && \"loBit out of range\"",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/APInt.h"
                ,0x585,"void llvm::APInt::setBits(unsigned int, unsigned int)");
}

Assistant:

void setBits(unsigned loBit, unsigned hiBit) {
    assert(hiBit <= BitWidth && "hiBit out of range");
    assert(loBit <= BitWidth && "loBit out of range");
    assert(loBit <= hiBit && "loBit greater than hiBit");
    if (loBit == hiBit)
      return;
    if (loBit < APINT_BITS_PER_WORD && hiBit <= APINT_BITS_PER_WORD) {
      uint64_t mask = WORD_MAX >> (APINT_BITS_PER_WORD - (hiBit - loBit));
      mask <<= loBit;
      if (isSingleWord())
        U.VAL |= mask;
      else
        U.pVal[0] |= mask;
    } else {
      setBitsSlowCase(loBit, hiBit);
    }
  }